

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# normalizer2impl.cpp
# Opt level: O0

void __thiscall
icu_63::Normalizer2Impl::makeCanonIterDataFromNorm16
          (Normalizer2Impl *this,UChar32 start,UChar32 end,uint16_t norm16,CanonIterData *newData,
          UErrorCode *errorCode)

{
  ushort uVar1;
  int iVar2;
  UBool UVar3;
  uint32_t uVar4;
  uint32_t uVar5;
  uint16_t *puVar6;
  ushort *puVar7;
  int local_5c;
  uint32_t c2Value;
  int32_t i;
  int32_t length;
  uint16_t firstUnit;
  uint16_t *mapping;
  uint32_t local_40;
  uint uStack_3c;
  uint16_t norm16_2;
  UChar32 c2;
  uint32_t newValue;
  uint32_t oldValue;
  UChar32 c;
  UErrorCode *errorCode_local;
  CanonIterData *newData_local;
  uint16_t norm16_local;
  UChar32 end_local;
  UChar32 start_local;
  Normalizer2Impl *this_local;
  
  UVar3 = isInert(norm16);
  if ((UVar3 == '\0') && ((newValue = start, norm16 < this->minYesNo || (this->minNoNo <= norm16))))
  {
    for (; (int)newValue <= end; newValue = newValue + 1) {
      uVar4 = umutablecptrie_get_63(newData->mutableTrie,newValue);
      UVar3 = isMaybeOrNonZeroCC(this,norm16);
      if (UVar3 == '\0') {
        if (norm16 < this->minYesNo) {
          uStack_3c = uVar4 | 0x40000000;
        }
        else {
          local_40 = newValue;
          UVar3 = isDecompNoAlgorithmic(this,norm16);
          mapping._6_2_ = norm16;
          if (UVar3 != '\0') {
            local_40 = mapAlgorithmic(this,newValue,norm16);
            mapping._6_2_ = getRawNorm16(this,local_40);
          }
          uStack_3c = uVar4;
          if (this->minYesNo < mapping._6_2_) {
            puVar6 = getMapping(this,mapping._6_2_);
            uVar1 = *puVar6;
            if ((((uVar1 & 0x80) != 0) && (newValue == local_40)) && ((puVar6[-1] & 0xff) != 0)) {
              uStack_3c = uVar4 | 0x80000000;
            }
            if ((uVar1 & 0x1f) != 0) {
              puVar7 = puVar6 + 1;
              local_5c = 1;
              local_40 = (uint32_t)*puVar7;
              if ((local_40 & 0xfffffc00) == 0xd800) {
                local_5c = 2;
                local_40 = local_40 * 0x400 + (uint)puVar6[2] + 0xfca02400;
              }
              CanonIterData::addToStartSet(newData,newValue,local_40,errorCode);
              if (this->minNoNo <= mapping._6_2_) {
                while (local_5c < (int)(uVar1 & 0x1f)) {
                  local_40 = (uint32_t)puVar7[local_5c];
                  iVar2 = local_5c + 1;
                  if ((local_40 & 0xfffffc00) == 0xd800) {
                    local_40 = local_40 * 0x400 + (uint)puVar7[local_5c + 1] + 0xfca02400;
                    iVar2 = local_5c + 2;
                  }
                  local_5c = iVar2;
                  uVar5 = umutablecptrie_get_63(newData->mutableTrie,local_40);
                  if ((uVar5 & 0x80000000) == 0) {
                    umutablecptrie_set_63
                              (newData->mutableTrie,local_40,uVar5 | 0x80000000,errorCode);
                  }
                }
              }
            }
          }
          else {
            CanonIterData::addToStartSet(newData,newValue,local_40,errorCode);
          }
        }
      }
      else {
        uStack_3c = uVar4 | 0x80000000;
        if (norm16 < 0xfc00) {
          uStack_3c = uVar4 | 0xc0000000;
        }
      }
      if (uStack_3c != uVar4) {
        umutablecptrie_set_63(newData->mutableTrie,newValue,uStack_3c,errorCode);
      }
    }
  }
  return;
}

Assistant:

void Normalizer2Impl::makeCanonIterDataFromNorm16(UChar32 start, UChar32 end, const uint16_t norm16,
                                                  CanonIterData &newData,
                                                  UErrorCode &errorCode) const {
    if(isInert(norm16) || (minYesNo<=norm16 && norm16<minNoNo)) {
        // Inert, or 2-way mapping (including Hangul syllable).
        // We do not write a canonStartSet for any yesNo character.
        // Composites from 2-way mappings are added at runtime from the
        // starter's compositions list, and the other characters in
        // 2-way mappings get CANON_NOT_SEGMENT_STARTER set because they are
        // "maybe" characters.
        return;
    }
    for(UChar32 c=start; c<=end; ++c) {
        uint32_t oldValue = umutablecptrie_get(newData.mutableTrie, c);
        uint32_t newValue=oldValue;
        if(isMaybeOrNonZeroCC(norm16)) {
            // not a segment starter if it occurs in a decomposition or has cc!=0
            newValue|=CANON_NOT_SEGMENT_STARTER;
            if(norm16<MIN_NORMAL_MAYBE_YES) {
                newValue|=CANON_HAS_COMPOSITIONS;
            }
        } else if(norm16<minYesNo) {
            newValue|=CANON_HAS_COMPOSITIONS;
        } else {
            // c has a one-way decomposition
            UChar32 c2=c;
            // Do not modify the whole-range norm16 value.
            uint16_t norm16_2=norm16;
            if (isDecompNoAlgorithmic(norm16_2)) {
                // Maps to an isCompYesAndZeroCC.
                c2 = mapAlgorithmic(c2, norm16_2);
                norm16_2 = getRawNorm16(c2);
                // No compatibility mappings for the CanonicalIterator.
                U_ASSERT(!(isHangulLV(norm16_2) || isHangulLVT(norm16_2)));
            }
            if (norm16_2 > minYesNo) {
                // c decomposes, get everything from the variable-length extra data
                const uint16_t *mapping=getMapping(norm16_2);
                uint16_t firstUnit=*mapping;
                int32_t length=firstUnit&MAPPING_LENGTH_MASK;
                if((firstUnit&MAPPING_HAS_CCC_LCCC_WORD)!=0) {
                    if(c==c2 && (*(mapping-1)&0xff)!=0) {
                        newValue|=CANON_NOT_SEGMENT_STARTER;  // original c has cc!=0
                    }
                }
                // Skip empty mappings (no characters in the decomposition).
                if(length!=0) {
                    ++mapping;  // skip over the firstUnit
                    // add c to first code point's start set
                    int32_t i=0;
                    U16_NEXT_UNSAFE(mapping, i, c2);
                    newData.addToStartSet(c, c2, errorCode);
                    // Set CANON_NOT_SEGMENT_STARTER for each remaining code point of a
                    // one-way mapping. A 2-way mapping is possible here after
                    // intermediate algorithmic mapping.
                    if(norm16_2>=minNoNo) {
                        while(i<length) {
                            U16_NEXT_UNSAFE(mapping, i, c2);
                            uint32_t c2Value = umutablecptrie_get(newData.mutableTrie, c2);
                            if((c2Value&CANON_NOT_SEGMENT_STARTER)==0) {
                                umutablecptrie_set(newData.mutableTrie, c2,
                                                   c2Value|CANON_NOT_SEGMENT_STARTER, &errorCode);
                            }
                        }
                    }
                }
            } else {
                // c decomposed to c2 algorithmically; c has cc==0
                newData.addToStartSet(c, c2, errorCode);
            }
        }
        if(newValue!=oldValue) {
            umutablecptrie_set(newData.mutableTrie, c, newValue, &errorCode);
        }
    }
}